

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O1

iterator __thiscall
MinVR::VRDataIndex::_getEntry(VRDataIndex *this,string *key,string *nameSpace,bool inherit)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  int iVar5;
  iterator iVar6;
  uint uVar7;
  undefined8 extraout_RDX;
  ulong uVar8;
  ulong uVar9;
  pointer pbVar10;
  string testSpace;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string validatedNameSpace;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elems;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  string local_90;
  ulong local_70;
  string *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (*(key->_M_dataplus)._M_p == '/') {
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
                    *)this,key);
    (this->_lastDatum)._M_node = iVar6._M_node;
  }
  else if ((nameSpace->_M_string_length == 1) &&
          (iVar5 = std::__cxx11::string::compare((char *)nameSpace), iVar5 == 0)) {
    std::operator+(&local_90,nameSpace,key);
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
                    *)this,&local_90);
    (this->_lastDatum)._M_node = iVar6._M_node;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    iVar6._M_node = (this->_lastDatum)._M_node;
  }
  else {
    validateNameSpace(&local_90,this,nameSpace);
    if (inherit) {
      _explodeName(&local_48,&local_90);
      uVar7 = (uint)((ulong)((long)local_48.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_48.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 0x24) & 1;
      uVar8 = (ulong)uVar7;
      if (uVar7 == 0) {
        paVar1 = &local_c0.field_2;
        local_a0 = &(this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header;
        uVar9 = (ulong)((uint)((ulong)((long)local_48.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_48.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 5) &
                       0x7fffffff);
        local_68 = key;
        do {
          local_70 = uVar8;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          vector<std::__cxx11::string*,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_60,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar9,(allocator_type *)&local_e0);
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          local_e0._M_string_length = 0;
          local_e0.field_2._M_local_buf[0] = '\0';
          for (pbVar10 = local_60.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pbVar10 !=
              local_60.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
            pcVar2 = (pbVar10->_M_dataplus)._M_p;
            local_c0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c0,pcVar2,pcVar2 + pbVar10->_M_string_length);
            std::__cxx11::string::append((char *)&local_c0);
            std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_c0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != paVar1) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
          }
          std::operator+(&local_c0,&local_e0,local_68);
          iVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
                          *)this,&local_c0);
          (this->_lastDatum)._M_node = iVar6._M_node;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != paVar1) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          p_Var3 = (this->_lastDatum)._M_node;
          if (p_Var3 != local_a0) {
            local_98 = p_Var3;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,
                            CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                     local_e0.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_60);
          uVar8 = local_70;
          if (p_Var3 != local_a0) break;
          uVar8 = CONCAT71((int7)((ulong)extraout_RDX >> 8),(long)uVar9 < 1);
          bVar4 = 0 < (long)uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar4);
      }
      iVar6._M_node = local_98;
      if ((uVar8 & 1) != 0) {
        iVar6._M_node = &(this->_theIndex)._M_t._M_impl.super__Rb_tree_header._M_header;
        (this->_lastDatum)._M_node = iVar6._M_node;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    }
    else {
      std::operator+(&local_e0,&local_90,key);
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
                      *)this,&local_e0);
      (this->_lastDatum)._M_node = iVar6._M_node;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,
                        CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                 local_e0.field_2._M_local_buf[0]) + 1);
      }
      iVar6._M_node = (this->_lastDatum)._M_node;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  return (iterator)iVar6._M_node;
}

Assistant:

VRDataIndex::VRDataMap::iterator
VRDataIndex::_getEntry(const std::string &key,
                       const std::string nameSpace,
                       const bool inherit) {

  // If the input key begins with a "/", it is a fully qualified
  // name already.  That is, it already includes the name space.
  if (key[0] == '/') {

    _lastDatum = _theIndex.find(key);
    return _lastDatum;

  } else if ((nameSpace.size() == 1) && (nameSpace.compare("/") == 0)) {
    // If we are looking for something in the root name space, that's
    // not so different than using a fully-qualified name.

    _lastDatum = _theIndex.find(nameSpace + key);
    return _lastDatum;

  } else {

    // If you're asking whether a fully-qualified name works, you want
    // a yes or no answer.  If you're asking about a relative name, you will
    // accept a name defined in a namespace senior to the one
    // specified.  So answering the query for an entry to match the
    // given name requires looking through the senior namespaces.

    std::string validatedNameSpace = validateNameSpace(nameSpace);

    // If inheritance is turned off, just check if this name exists.
    if (!inherit) {
      _lastDatum = _theIndex.find(validatedNameSpace + key);
      return _lastDatum;
    }

    // Separate the name space into its constituent elements.
    std::vector<std::string> elems = _explodeName(validatedNameSpace);

    // We start from the longest name space and peel off the rightmost
    // element each iteration until we find a match, or not.  This
    // provides for the most local version of key to prevail.  The
    // last iteration creates an empty testSpace, on purpose, to test
    // the root level nameSpace.
    for (int N = (int)elems.size(); N >= 0; --N) {

      std::vector<std::string> names(&elems[0], &elems[0] + N);
      std::string testSpace;

      for (std::vector<std::string>::iterator it = names.begin();
           it != names.end(); ++it) {

        testSpace += *it + "/" ;
      }

      _lastDatum = _theIndex.find(testSpace + key);
      if (_lastDatum != _theIndex.end()) {
        return _lastDatum;
      }
    }

    // If we are here, there is no matching name in the index.
    _lastDatum = _theIndex.end();
    return _lastDatum;
  }
}